

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall Assimp::ASEImporter::AddMeshes(ASEImporter *this,BaseNode *snode,aiNode *node)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  aiColor4D *paVar13;
  aiMesh *paVar14;
  ulong uVar15;
  uint *puVar16;
  aiScene *paVar17;
  BaseNode *pBVar18;
  aiVector3D *paVar19;
  aiVector3D *paVar20;
  ulong uVar21;
  aiMatrix4x4 m;
  aiMatrix4x4t<float> local_78;
  
  paVar17 = this->pcScene;
  if (paVar17->mNumMeshes != 0) {
    uVar15 = 0;
    do {
      paVar13 = paVar17->mMeshes[uVar15]->mColors[2];
      pBVar18 = (BaseNode *)&paVar13[4].b;
      if (paVar13 == (aiColor4D *)0x0) {
        pBVar18 = (BaseNode *)0x0;
      }
      if (pBVar18 == snode) {
        node->mNumMeshes = node->mNumMeshes + 1;
      }
      uVar15 = uVar15 + 1;
      paVar17 = this->pcScene;
    } while (uVar15 < paVar17->mNumMeshes);
  }
  if ((ulong)node->mNumMeshes != 0) {
    puVar16 = (uint *)operator_new__((ulong)node->mNumMeshes << 2);
    node->mMeshes = puVar16;
    paVar17 = this->pcScene;
    if (paVar17->mNumMeshes != 0) {
      uVar21 = 0;
      uVar15 = 0;
      do {
        paVar14 = paVar17->mMeshes[uVar21];
        paVar13 = paVar14->mColors[2];
        pBVar18 = (BaseNode *)&paVar13[4].b;
        if (paVar13 == (aiColor4D *)0x0) {
          pBVar18 = (BaseNode *)0x0;
        }
        if (pBVar18 == snode) {
          node->mMeshes[uVar15] = (uint)uVar21;
          local_78.a1 = paVar13[9].r;
          local_78.a2 = paVar13[9].g;
          local_78.a3 = paVar13[9].b;
          local_78.a4 = paVar13[9].a;
          local_78.b1 = paVar13[10].r;
          local_78.b2 = paVar13[10].g;
          local_78.b3 = paVar13[10].b;
          local_78.b4 = paVar13[10].a;
          local_78.c1 = paVar13[0xb].r;
          local_78.c2 = paVar13[0xb].g;
          local_78.c3 = paVar13[0xb].b;
          local_78.c4 = paVar13[0xb].a;
          local_78.d1 = paVar13[0xc].r;
          local_78.d2 = paVar13[0xc].g;
          local_78.d3 = paVar13[0xc].b;
          local_78.d4 = paVar13[0xc].a;
          aiMatrix4x4t<float>::Inverse(&local_78);
          if ((ulong)paVar14->mNumVertices != 0) {
            paVar19 = paVar14->mVertices;
            paVar20 = paVar19 + paVar14->mNumVertices;
            do {
              fVar1 = paVar19->x;
              fVar2 = paVar19->y;
              fVar3 = paVar19->z;
              paVar19->x = local_78.a3 * fVar3 + local_78.a1 * fVar1 + local_78.a2 * fVar2 +
                           local_78.a4;
              paVar19->y = local_78.b3 * fVar3 + local_78.b1 * fVar1 + local_78.b2 * fVar2 +
                           local_78.b4;
              paVar19->z = fVar3 * local_78.c3 + fVar1 * local_78.c1 + fVar2 * local_78.c2 +
                           local_78.c4;
              paVar19 = paVar19 + 1;
            } while (paVar19 != paVar20);
          }
          paVar20 = paVar14->mNormals;
          if ((paVar20 != (aiVector3D *)0x0) && ((ulong)paVar14->mNumVertices != 0)) {
            fVar1 = paVar13[9].r;
            fVar2 = paVar13[9].g;
            fVar3 = paVar13[9].b;
            fVar4 = paVar13[10].r;
            fVar5 = paVar13[10].g;
            fVar6 = paVar13[10].b;
            fVar7 = paVar13[0xb].r;
            fVar8 = paVar13[0xb].g;
            fVar9 = paVar13[0xb].b;
            paVar19 = paVar20 + paVar14->mNumVertices;
            do {
              fVar10 = paVar20->x;
              fVar11 = paVar20->y;
              fVar12 = paVar20->z;
              paVar20->x = fVar7 * fVar12 + fVar1 * fVar10 + fVar4 * fVar11;
              paVar20->y = fVar8 * fVar12 + fVar2 * fVar10 + fVar5 * fVar11;
              paVar20->z = fVar12 * fVar9 + fVar10 * fVar3 + fVar11 * fVar6;
              paVar20 = paVar20 + 1;
            } while (paVar20 != paVar19);
          }
          uVar15 = (ulong)((int)uVar15 + 1);
        }
        uVar21 = uVar21 + 1;
        paVar17 = this->pcScene;
      } while (uVar21 < paVar17->mNumMeshes);
    }
  }
  return;
}

Assistant:

void ASEImporter::AddMeshes(const ASE::BaseNode* snode,aiNode* node)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)   {
        // Get the name of the mesh (the mesh instance has been temporarily stored in the third vertex color)
        const aiMesh* pcMesh  = pcScene->mMeshes[i];
        const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];

        if (mesh == snode) {
            ++node->mNumMeshes;
        }
    }

    if(node->mNumMeshes)    {
        node->mMeshes = new unsigned int[node->mNumMeshes];
        for (unsigned int i = 0, p = 0; i < pcScene->mNumMeshes;++i)    {

            const aiMesh* pcMesh  = pcScene->mMeshes[i];
            const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];
            if (mesh == snode)  {
                node->mMeshes[p++] = i;

                // Transform all vertices of the mesh back into their local space ->
                // at the moment they are pretransformed
                aiMatrix4x4 m  = mesh->mTransform;
                m.Inverse();

                aiVector3D* pvCurPtr = pcMesh->mVertices;
                const aiVector3D* pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                while (pvCurPtr != pvEndPtr)    {
                    *pvCurPtr = m * (*pvCurPtr);
                    pvCurPtr++;
                }

                // Do the same for the normal vectors, if we have them.
                // As always, inverse transpose.
                if (pcMesh->mNormals)   {
                    aiMatrix3x3 m3 = aiMatrix3x3( mesh->mTransform );
                    m3.Transpose();

                    pvCurPtr = pcMesh->mNormals;
                    pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                    while (pvCurPtr != pvEndPtr)    {
                        *pvCurPtr = m3 * (*pvCurPtr);
                        pvCurPtr++;
                    }
                }
            }
        }
    }
}